

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::M3DImporter::calculateOffsetMatrix(M3DImporter *this,aiNode *pNode,aiMatrix4x4 *m)

{
  aiMatrix4x4 *m_local;
  aiNode *pNode_local;
  M3DImporter *this_local;
  
  if (pNode == (aiNode *)0x0) {
    __assert_fail("pNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x289,"void Assimp::M3DImporter::calculateOffsetMatrix(aiNode *, aiMatrix4x4 *)")
    ;
  }
  if (this->mScene != (aiScene *)0x0) {
    if (pNode->mParent == (aiNode *)0x0) {
      memcpy(m,&pNode->mTransformation,0x40);
    }
    else {
      calculateOffsetMatrix(this,pNode->mParent,m);
      aiMatrix4x4t<float>::operator*=(m,&pNode->mTransformation);
    }
    return;
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x28a,"void Assimp::M3DImporter::calculateOffsetMatrix(aiNode *, aiMatrix4x4 *)");
}

Assistant:

void M3DImporter::calculateOffsetMatrix(aiNode *pNode, aiMatrix4x4 *m) {
	ai_assert(pNode != nullptr);
	ai_assert(mScene != nullptr);

	if (pNode->mParent) {
		calculateOffsetMatrix(pNode->mParent, m);
		*m *= pNode->mTransformation;
	} else {
		*m = pNode->mTransformation;
	}
}